

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish.cpp
# Opt level: O2

int __thiscall ncnn::HardSwish::forward_inplace(HardSwish *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar7 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  uVar9 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar9;
  }
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar9;
  }
  sVar3 = bottom_top_blob->elemsize;
  do {
    if (uVar9 == uVar6) {
      return 0;
    }
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      fVar1 = *(float *)((long)pvVar7 + uVar8 * 4);
      fVar10 = 0.0;
      if (fVar1 < this->lower) {
LAB_004234cf:
        *(float *)((long)pvVar7 + uVar8 * 4) = fVar10;
      }
      else if (fVar1 < this->upper || fVar1 == this->upper) {
        fVar10 = (this->alpha * fVar1 + this->beta) * fVar1;
        goto LAB_004234cf;
      }
    }
    uVar9 = uVar9 + 1;
    pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
  } while( true );
}

Assistant:

int HardSwish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper)
                ;
            else
                ptr[i] = ptr[i] * (ptr[i] * alpha + beta);
        }
    }

    return 0;
}